

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  ImFont *this;
  undefined4 uVar1;
  undefined4 uVar2;
  char *text_end;
  ImDrawList *pIVar3;
  ImDrawList *draw_list_00;
  uint uVar4;
  ImU32 col;
  ImGuiContext *g;
  ImGuiContext *pIVar5;
  char *text_display_end;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float max_width;
  float fVar9;
  char *text_end_ellipsis;
  float local_84;
  ImVec2 local_80;
  ImVec2 local_78;
  undefined1 local_68 [16];
  uint dummy;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  ImGuiContext *local_48;
  ImDrawList *local_40;
  ImVec2 local_38;
  undefined8 extraout_XMM0_Qb;
  
  pIVar5 = GImGui;
  if ((text_end_full == (char *)0x0) && (text_end_full = text, text != (char *)0xffffffffffffffff))
  {
    do {
      if (*text_end_full == '#') {
        if (text_end_full[1] == '#') goto LAB_002cd03d;
      }
      else if (*text_end_full == '\0') goto LAB_002cd03d;
      text_end_full = text_end_full + 1;
    } while (text_end_full != (char *)0xffffffffffffffff);
    text_end_full = (char *)0xffffffffffffffff;
  }
LAB_002cd03d:
  local_84 = clip_max_x;
  if (text_size_if_known == (ImVec2 *)0x0) {
    if (text_end_full == text) {
      local_80 = (ImVec2)((ulong)(uint)GImGui->FontSize << 0x20);
    }
    else {
      auVar7._0_8_ = ImFont::CalcTextSizeA
                               (GImGui->Font,GImGui->FontSize,3.4028235e+38,0.0,text,text_end_full,
                                (char **)0x0);
      auVar7._8_8_ = extraout_XMM0_Qb;
      auVar8._4_12_ = auVar7._4_12_;
      auVar8._0_4_ = (float)(int)(auVar7._0_4_ + 0.95);
      local_80 = auVar8._0_8_;
    }
  }
  else {
    local_80 = *text_size_if_known;
  }
  if (local_80.x <= pos_max->x - pos_min->x) {
    fStack_54 = pos_max->y;
    dummy = (uint)local_84;
    text_end_ellipsis = (char *)0x0;
    RenderTextClippedEx(draw_list,pos_min,(ImVec2 *)&dummy,text,text_end_full,&local_80,
                        (ImVec2 *)&text_end_ellipsis,(ImRect *)0x0);
  }
  else {
    local_48 = pIVar5;
    this = draw_list->_Data->Font;
    fVar9 = draw_list->_Data->FontSize;
    text_end_ellipsis = (char *)0x0;
    max_width = (pos_max->x + -5.0) - pos_min->x;
    if (max_width <= 1.0) {
      max_width = 1.0;
    }
    local_68._0_4_ = fVar9;
    local_40 = draw_list;
    local_78 = ImFont::CalcTextSizeA(this,fVar9,max_width,0.0,text,text_end_full,&text_end_ellipsis)
    ;
    text_end = text_end_ellipsis;
    pIVar3 = local_40;
    if (text_end_ellipsis < text_end_full && text_end_ellipsis == text) {
      _dummy = (ImVec2)((ulong)_dummy & 0xffffffff00000000);
      uVar4 = ImTextCharFromUtf8(&dummy,text,text_end_full);
      text_end_ellipsis = text + uVar4;
      local_78 = ImFont::CalcTextSizeA
                           (this,(float)local_68._0_4_,3.4028235e+38,0.0,text,text_end_ellipsis,
                            (char **)0x0);
      text_end = text_end_ellipsis;
      pIVar3 = local_40;
    }
    while ((draw_list_00 = local_40, local_40 = pIVar3, text < text_end &&
           ((text_end[-1] == ' ' || (text_end[-1] == '\t'))))) {
      text_end_ellipsis = text_end + -1;
      IVar6 = ImFont::CalcTextSizeA
                        (this,(float)local_68._0_4_,3.4028235e+38,0.0,text_end_ellipsis,text_end,
                         (char **)0x0);
      local_78.x = local_78.x - IVar6.x;
      text_end = text_end_ellipsis;
      pIVar3 = local_40;
      local_40 = draw_list_00;
    }
    fStack_54 = pos_max->y;
    dummy = (uint)local_84;
    local_38.x = 0.0;
    local_38.y = 0.0;
    text_end_ellipsis = text_end;
    RenderTextClippedEx(draw_list_00,pos_min,(ImVec2 *)&dummy,text,text_end,&local_80,&local_38,
                        (ImRect *)0x0);
    fVar9 = local_78.x + pos_min->x + 1.0;
    pIVar5 = local_48;
    if (fVar9 + 5.0 + -1.0 <= ellipsis_max_x) {
      local_68 = ZEXT416((uint)pos_min->y);
      dummy = (uint)(GImGui->Style).Colors[0].x;
      fStack_54 = (GImGui->Style).Colors[0].y;
      uVar1 = (GImGui->Style).Colors[0].z;
      uVar2 = (GImGui->Style).Colors[0].w;
      fStack_4c = (GImGui->Style).Alpha * (float)uVar2;
      fStack_50 = (float)uVar1;
      local_78.x = fVar9;
      col = ColorConvertFloat4ToU32((ImVec4 *)&dummy);
      IVar6.y = (float)local_68._0_4_;
      IVar6.x = local_78.x;
      RenderPixelEllipsis(draw_list_00,IVar6,col,3);
      pIVar5 = local_48;
    }
  }
  if (pIVar5->LogEnabled == true) {
    LogRenderedText(pos_min,text,text_end_full);
  }
  return;
}

Assistant:

void    ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        // FIXME-STYLE: RenderPixelEllipsis() style should use actual font data.
        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const int ellipsis_dot_count = 3;
        const float ellipsis_width = (1.0f + 1.0f) * ellipsis_dot_count - 1.0f;
        const char* text_end_ellipsis = NULL;

        float text_width = ImMax((pos_max.x - ellipsis_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));

        const float ellipsis_x = pos_min.x + text_size_clipped_x + 1.0f;
        if (ellipsis_x + ellipsis_width - 1.0f <= ellipsis_max_x)
            RenderPixelEllipsis(draw_list, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_dot_count);
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}